

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void streamout(stringstream *oss,char *s,int length)

{
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  
  if (in_EDX == 0) {
    std::operator<<((ostream *)(in_RDI + 0x10),in_RSI);
  }
  else {
    std::ostream::write((char *)(in_RDI + 0x10),(long)in_RSI);
  }
  return;
}

Assistant:

void
streamout(stringstream& oss, const char* s, int length)
{
    // Can't find a way to get stringstream to truncate a stream.
    if (length != 0)
        oss.write(s, length);
    else
        oss << s;
}